

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromFormat
          (ArrowType *this,DBConfig *config,ArrowSchema *schema,string *format)

{
  char *pcVar1;
  ArrowSchema *pAVar2;
  long lVar3;
  bool bVar4;
  int val;
  unsigned_long index;
  pointer pAVar5;
  reference pvVar6;
  ArrowType *pAVar7;
  ulong uVar8;
  InvalidInputException *pIVar9;
  NotImplementedException *pNVar10;
  long lVar11;
  ArrowVariableSizeType size_type;
  ulong uVar12;
  pointer *__ptr;
  bool view;
  string *this_00;
  vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> children;
  unsigned_long fixed_size;
  _Head_base<0UL,_duckdb::ArrowType_*,_false> _Stack_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  LogicalType array_type;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> value_type;
  string parameters;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> child_type;
  undefined1 local_128 [8];
  templated_unique_single_t inner_struct;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> type;
  shared_ptr<duckdb::ArrowType,_true> local_100;
  optional_idx local_f0;
  LogicalType local_e8;
  LogicalType local_d0;
  child_list_t<LogicalType> local_b8;
  child_list_t<LogicalType> local_a0;
  child_list_t<LogicalType> local_88;
  child_list_t<LogicalType> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetTypeFromFormat((ArrowType *)&type,format);
  if (type.super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
      super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
      super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_true>)0x0) {
    (this->extension_data).internal.
    super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         type.super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
         super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
         super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl;
    type.super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
    super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
    super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (__uniq_ptr_data<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_true>)0x0
    ;
    goto LAB_00a7c85f;
  }
  bVar4 = ::std::operator==(format,"+l");
  size_type = NORMAL;
  view = false;
  if (!bVar4) {
    bVar4 = ::std::operator==(format,"+L");
    size_type = SUPER_SIZE;
    if (bVar4) {
      view = false;
    }
    else {
      bVar4 = ::std::operator==(format,"+vl");
      view = true;
      if (bVar4) {
        size_type = NORMAL;
      }
      else {
        bVar4 = ::std::operator==(format,"+vL");
        if (!bVar4) {
          pcVar1 = (format->_M_dataplus)._M_p;
          if ((*pcVar1 == '+') && (pcVar1[1] == 'w')) {
            ::std::__cxx11::string::find((char)format,0x3a);
            ::std::__cxx11::string::substr((ulong)&parameters,(ulong)format);
            val = std::__cxx11::stoi(&parameters,(size_t *)0x0,10);
            index = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
            fixed_size = index;
            GetArrowLogicalType((ArrowType *)&child_type,config,*schema->children);
            pAVar5 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                     operator->(&child_type);
            GetDuckType((LogicalType *)&children,pAVar5,false);
            optional_idx::optional_idx(&local_f0,index);
            LogicalType::ARRAY(&array_type,(LogicalType *)&children,local_f0);
            LogicalType::~LogicalType((LogicalType *)&children);
            make_uniq<duckdb::ArrowArrayInfo,duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>,unsigned_long&>
                      ((duckdb *)&children,&child_type,&fixed_size);
            make_uniq<duckdb::ArrowType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ArrowArrayInfo,std::default_delete<duckdb::ArrowArrayInfo>,true>>
                      ((duckdb *)this,&array_type,
                       (unique_ptr<duckdb::ArrowArrayInfo,_std::default_delete<duckdb::ArrowArrayInfo>,_true>
                        *)&children);
            if (children.
                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)((((children.
                            super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                            .
                            super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->internal).
                          super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->extension_data).internal.
                        super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)();
            }
            LogicalType::~LogicalType(&array_type);
            ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
            ~unique_ptr(&child_type.
                         super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                       );
LAB_00a7d0f7:
            ::std::__cxx11::string::~string((string *)&parameters);
          }
          else {
            bVar4 = ::std::operator==(format,"+s");
            if (bVar4) {
              array_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              children.
              super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              array_type.id_ = INVALID;
              array_type.physical_type_ = ~INVALID;
              array_type._2_6_ = 0;
              array_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              children.
              super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              children.
              super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              uVar8 = schema->n_children;
              if (uVar8 == 0) {
                pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&parameters,
                           "Attempted to convert a STRUCT with no fields to DuckDB which is not supported"
                           ,(allocator *)&fixed_size);
                InvalidInputException::InvalidInputException(pIVar9,&parameters);
                __cxa_throw(pIVar9,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              for (uVar12 = 0; uVar12 < uVar8; uVar12 = uVar12 + 1) {
                GetArrowLogicalType((ArrowType *)&parameters,config,schema->children[uVar12]);
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>>
                          ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                            *)&children,
                           (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                            *)&parameters);
                ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
                ~unique_ptr((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                             *)&parameters);
                pAVar2 = schema->children[uVar12];
                pvVar6 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::back(&children);
                pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator->(pvVar6);
                GetDuckType((LogicalType *)&parameters,pAVar7,false);
                ::std::
                vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                ::emplace_back<char_const*&,duckdb::LogicalType>
                          ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                            *)&array_type,&pAVar2->name,(LogicalType *)&parameters);
                LogicalType::~LogicalType((LogicalType *)&parameters);
                uVar8 = schema->n_children;
              }
              make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                        ((duckdb *)&fixed_size,&children);
              local_68.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)array_type._0_8_;
              local_68.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)array_type.type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
              local_68.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)array_type.type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              array_type.id_ = INVALID;
              array_type.physical_type_ = ~INVALID;
              array_type._2_6_ = 0;
              array_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              array_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              LogicalType::STRUCT((LogicalType *)&parameters,&local_68);
              make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                        ((duckdb *)this,(LogicalType *)&parameters,
                         (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                          *)&fixed_size);
              LogicalType::~LogicalType((LogicalType *)&parameters);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)&local_68);
              if (fixed_size != 0) {
                (**(code **)(*(long *)fixed_size + 8))();
              }
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ::~vector(&children.
                         super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                       );
              this_00 = (string *)&array_type;
            }
            else {
              pcVar1 = (format->_M_dataplus)._M_p;
              if ((*pcVar1 == '+') && (pcVar1[1] == 'u')) {
                if (pcVar1[2] != 's') {
                  pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&parameters,"Unsupported Internal Arrow Type: \"%c\" Union",
                             (allocator *)&array_type);
                  NotImplementedException::NotImplementedException<char>
                            (pNVar10,&parameters,(format->_M_dataplus)._M_p[2]);
                  __cxa_throw(pNVar10,&NotImplementedException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                ::std::__cxx11::string::string
                          ((string *)&parameters,"+us:",(allocator *)&array_type);
                ::std::__cxx11::string::substr((ulong)&array_type,(ulong)format);
                StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)&children,(string *)&array_type,',');
                ::std::__cxx11::string::~string((string *)&array_type);
                local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                fixed_size = 0;
                _Stack_1c0._M_head_impl = (ArrowType *)0x0;
                child_type.
                super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
                super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>
                .super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl =
                     (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
                     (__uniq_ptr_data<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_true>
                      )0x0;
                uVar8 = schema->n_children;
                if (uVar8 == 0) {
                  pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&array_type,
                             "Attempted to convert a UNION with no fields to DuckDB which is not supported"
                             ,(allocator *)&value_type);
                  InvalidInputException::InvalidInputException(pIVar9,(string *)&array_type);
                  __cxa_throw(pIVar9,&InvalidInputException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                for (uVar12 = 0; uVar12 < uVar8; uVar12 = uVar12 + 1) {
                  pAVar2 = schema->children[uVar12];
                  GetArrowLogicalType((ArrowType *)&array_type,config,pAVar2);
                  ::std::
                  vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>>
                            ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                              *)&child_type,
                             (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                              *)&array_type);
                  ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
                  ~unique_ptr((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                               *)&array_type);
                  pvVar6 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::back
                                     ((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)
                                      &child_type);
                  pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator->(pvVar6);
                  GetDuckType(&array_type,pAVar7,false);
                  ::std::
                  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  ::emplace_back<char_const*&,duckdb::LogicalType>
                            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                              *)&fixed_size,&pAVar2->name,&array_type);
                  LogicalType::~LogicalType(&array_type);
                  uVar8 = schema->n_children;
                }
                make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                          ((duckdb *)&value_type,
                           (vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)&child_type)
                ;
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          *)&local_a0,
                         (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          *)&fixed_size);
                LogicalType::UNION(&array_type,&local_a0);
                make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                          ((duckdb *)this,&array_type,
                           (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                            *)&value_type);
                LogicalType::~LogicalType(&array_type);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           *)&local_a0);
                if (value_type.
                    super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>
                    .super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl !=
                    (__uniq_ptr_data<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_true>
                     )0x0) {
                  (**(code **)(*(long *)value_type.
                                        super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>
                                        .super__Head_base<0UL,_duckdb::ArrowType_*,_false>.
                                        _M_head_impl + 8))();
                }
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ::~vector((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                           *)&child_type);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           *)&fixed_size);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&children);
                goto LAB_00a7d0f7;
              }
              bVar4 = ::std::operator==(format,"+r");
              if (!bVar4) {
                bVar4 = ::std::operator==(format,"+m");
                if (!bVar4) {
                  pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&parameters,"Unsupported Internal Arrow Type %s",
                             (allocator *)&array_type);
                  ::std::__cxx11::string::string((string *)&local_50,(string *)format);
                  NotImplementedException::NotImplementedException<std::__cxx11::string>
                            (pNVar10,&parameters,&local_50);
                  __cxa_throw(pNVar10,&NotImplementedException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                pAVar2 = *schema->children;
                GetArrowLogicalType((ArrowType *)&child_type,config,*pAVar2->children);
                GetArrowLogicalType((ArrowType *)&value_type,config,pAVar2->children[1]);
                array_type.id_ = INVALID;
                array_type.physical_type_ = ~INVALID;
                array_type._2_6_ = 0;
                array_type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                array_type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                pAVar5 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                         ::operator->(&child_type);
                GetDuckType((LogicalType *)&children,pAVar5,false);
                parameters._M_dataplus._M_p = "key";
                LogicalType::LogicalType
                          ((LogicalType *)&parameters._M_string_length,(LogicalType *)&children);
                ::std::
                vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                ::emplace_back<std::pair<char_const*,duckdb::LogicalType>>
                          ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                            *)&array_type,(pair<const_char_*,_duckdb::LogicalType> *)&parameters);
                LogicalType::~LogicalType((LogicalType *)&parameters._M_string_length);
                LogicalType::~LogicalType((LogicalType *)&children);
                pAVar5 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                         ::operator->(&value_type);
                GetDuckType((LogicalType *)&children,pAVar5,false);
                parameters._M_dataplus._M_p = "value";
                LogicalType::LogicalType
                          ((LogicalType *)&parameters._M_string_length,(LogicalType *)&children);
                ::std::
                vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                ::emplace_back<std::pair<char_const*,duckdb::LogicalType>>
                          ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                            *)&array_type,(pair<const_char_*,_duckdb::LogicalType> *)&parameters);
                LogicalType::~LogicalType((LogicalType *)&parameters._M_string_length);
                LogicalType::~LogicalType((LogicalType *)&children);
                pAVar5 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                         ::operator->(&child_type);
                GetDuckType(&local_d0,pAVar5,false);
                pAVar5 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                         ::operator->(&value_type);
                GetDuckType(&local_e8,pAVar5,false);
                LogicalType::MAP((LogicalType *)&parameters,&local_d0,&local_e8);
                LogicalType::~LogicalType(&local_e8);
                LogicalType::~LogicalType(&local_d0);
                children.
                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                children.
                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                children.
                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ::reserve(&children.
                           super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                          ,2);
                ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
                          ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&fixed_size
                           ,&child_type.
                             super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                          );
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                ::emplace_back<duckdb::shared_ptr<duckdb::ArrowType,true>>
                          ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                            *)&children,(shared_ptr<duckdb::ArrowType,_true> *)&fixed_size);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_1c0);
                ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
                          ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&fixed_size
                           ,&value_type.
                             super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                          );
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                ::emplace_back<duckdb::shared_ptr<duckdb::ArrowType,true>>
                          ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                            *)&children,(shared_ptr<duckdb::ArrowType,_true> *)&fixed_size);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_1c0);
                local_88.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)array_type._0_8_;
                local_88.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)array_type.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                local_88.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)array_type.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                array_type.id_ = INVALID;
                array_type.physical_type_ = ~INVALID;
                array_type._2_6_ = 0;
                array_type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                array_type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                LogicalType::STRUCT((LogicalType *)&fixed_size,&local_88);
                make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                          ((duckdb *)local_128,&children);
                make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                          ((duckdb *)&inner_struct,(LogicalType *)&fixed_size,
                           (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                            *)local_128);
                if (local_128 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_128 + 8))();
                }
                LogicalType::~LogicalType((LogicalType *)&fixed_size);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           *)&local_88);
                ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
                          ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_100,
                           &inner_struct.
                            super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                          );
                ArrowListInfo::List((ArrowListInfo *)&fixed_size,&local_100,NORMAL);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_100.internal.
                            super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                make_uniq<duckdb::ArrowType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ArrowListInfo,std::default_delete<duckdb::ArrowListInfo>,true>>
                          ((duckdb *)this,(LogicalType *)&parameters,
                           (unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>
                            *)&fixed_size);
                if (fixed_size != 0) {
                  (**(code **)(*(long *)fixed_size + 8))();
                }
                ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
                ~unique_ptr(&inner_struct.
                             super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                           );
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                ::~vector(&children.
                           super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                         );
                LogicalType::~LogicalType((LogicalType *)&parameters);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           *)&array_type);
                ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
                ~unique_ptr(&value_type.
                             super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                           );
                ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
                ~unique_ptr(&child_type.
                             super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                           );
                goto LAB_00a7c85f;
              }
              parameters._M_dataplus._M_p = (pointer)0x0;
              parameters._M_string_length = 0;
              parameters.field_2._M_allocated_capacity = 0;
              array_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              array_type.id_ = INVALID;
              array_type.physical_type_ = ~INVALID;
              array_type._2_6_ = 0;
              array_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              lVar3 = schema->n_children;
              for (lVar11 = 0; lVar3 != lVar11; lVar11 = lVar11 + 1) {
                pAVar2 = schema->children[lVar11];
                GetArrowLogicalType((ArrowType *)&children,config,pAVar2);
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>>
                          ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                            *)&array_type,
                           (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                            *)&children);
                ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::
                ~unique_ptr((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                             *)&children);
                pvVar6 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::back
                                   ((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)
                                    &array_type);
                pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator->(pvVar6);
                GetDuckType((LogicalType *)&children,pAVar7,false);
                ::std::
                vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                ::emplace_back<char_const*&,duckdb::LogicalType>
                          ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                            *)&parameters,&pAVar2->name,(LogicalType *)&children);
                LogicalType::~LogicalType((LogicalType *)&children);
              }
              make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                        ((duckdb *)&fixed_size,
                         (vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)&array_type);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        *)&local_b8,
                       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        *)&parameters);
              LogicalType::STRUCT((LogicalType *)&children,&local_b8);
              make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                        ((duckdb *)this,(LogicalType *)&children,
                         (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                          *)&fixed_size);
              LogicalType::~LogicalType((LogicalType *)&children);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)&local_b8);
              pAVar5 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                       operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                   *)this);
              SetRunEndEncoded(pAVar5);
              if (fixed_size != 0) {
                (**(code **)(*(long *)fixed_size + 8))();
              }
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ::~vector((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                         *)&array_type);
              this_00 = &parameters;
            }
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)this_00);
          }
          goto LAB_00a7c85f;
        }
      }
    }
  }
  CreateListType(this,config,*schema->children,size_type,view);
LAB_00a7c85f:
  ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
            (&type.super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromFormat(DBConfig &config, ArrowSchema &schema, string &format) {
	auto type = GetTypeFromFormat(format);
	if (type) {
		return type;
	}
	if (format == "+l") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::NORMAL, false);
	} else if (format == "+L") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::SUPER_SIZE, false);
	} else if (format == "+vl") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::NORMAL, true);
	} else if (format == "+vL") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::SUPER_SIZE, true);
	} else if (format[0] == '+' && format[1] == 'w') {
		std::string parameters = format.substr(format.find(':') + 1);
		auto fixed_size = NumericCast<idx_t>(std::stoi(parameters));
		auto child_type = GetArrowLogicalType(config, *schema.children[0]);

		auto array_type = LogicalType::ARRAY(child_type->GetDuckType(), fixed_size);
		auto type_info = make_uniq<ArrowArrayInfo>(std::move(child_type), fixed_size);
		return make_uniq<ArrowType>(array_type, std::move(type_info));
	} else if (format == "+s") {
		child_list_t<LogicalType> child_types;
		vector<shared_ptr<ArrowType>> children;
		if (schema.n_children == 0) {
			throw InvalidInputException(
			    "Attempted to convert a STRUCT with no fields to DuckDB which is not supported");
		}
		for (idx_t type_idx = 0; type_idx < static_cast<idx_t>(schema.n_children); type_idx++) {
			children.emplace_back(GetArrowLogicalType(config, *schema.children[type_idx]));
			child_types.emplace_back(schema.children[type_idx]->name, children.back()->GetDuckType());
		}
		auto type_info = make_uniq<ArrowStructInfo>(std::move(children));
		auto struct_type = make_uniq<ArrowType>(LogicalType::STRUCT(std::move(child_types)), std::move(type_info));
		return struct_type;
	} else if (format[0] == '+' && format[1] == 'u') {
		if (format[2] != 's') {
			throw NotImplementedException("Unsupported Internal Arrow Type: \"%c\" Union", format[2]);
		}
		D_ASSERT(format[3] == ':');

		std::string prefix = "+us:";
		// TODO: what are these type ids actually for?
		auto type_ids = StringUtil::Split(format.substr(prefix.size()), ',');

		child_list_t<LogicalType> members;
		vector<shared_ptr<ArrowType>> children;
		if (schema.n_children == 0) {
			throw InvalidInputException("Attempted to convert a UNION with no fields to DuckDB which is not supported");
		}
		for (idx_t type_idx = 0; type_idx < static_cast<idx_t>(schema.n_children); type_idx++) {
			auto type = schema.children[type_idx];

			children.emplace_back(GetArrowLogicalType(config, *type));
			members.emplace_back(type->name, children.back()->GetDuckType());
		}

		auto type_info = make_uniq<ArrowStructInfo>(std::move(children));
		auto union_type = make_uniq<ArrowType>(LogicalType::UNION(members), std::move(type_info));
		return union_type;
	} else if (format == "+r") {
		child_list_t<LogicalType> members;
		vector<shared_ptr<ArrowType>> children;
		idx_t n_children = static_cast<idx_t>(schema.n_children);
		D_ASSERT(n_children == 2);
		D_ASSERT(string(schema.children[0]->name) == "run_ends");
		D_ASSERT(string(schema.children[1]->name) == "values");
		for (idx_t i = 0; i < n_children; i++) {
			auto type = schema.children[i];
			children.emplace_back(GetArrowLogicalType(config, *type));
			members.emplace_back(type->name, children.back()->GetDuckType());
		}

		auto type_info = make_uniq<ArrowStructInfo>(std::move(children));
		auto struct_type = make_uniq<ArrowType>(LogicalType::STRUCT(members), std::move(type_info));
		struct_type->SetRunEndEncoded();
		return struct_type;
	} else if (format == "+m") {
		auto &arrow_struct_type = *schema.children[0];
		D_ASSERT(arrow_struct_type.n_children == 2);
		auto key_type = GetArrowLogicalType(config, *arrow_struct_type.children[0]);
		auto value_type = GetArrowLogicalType(config, *arrow_struct_type.children[1]);
		child_list_t<LogicalType> key_value;
		key_value.emplace_back(std::make_pair("key", key_type->GetDuckType()));
		key_value.emplace_back(std::make_pair("value", value_type->GetDuckType()));

		auto map_type = LogicalType::MAP(key_type->GetDuckType(), value_type->GetDuckType());
		vector<shared_ptr<ArrowType>> children;
		children.reserve(2);
		children.push_back(std::move(key_type));
		children.push_back(std::move(value_type));
		auto inner_struct = make_uniq<ArrowType>(LogicalType::STRUCT(std::move(key_value)),
		                                         make_uniq<ArrowStructInfo>(std::move(children)));
		auto map_type_info = ArrowListInfo::List(std::move(inner_struct), ArrowVariableSizeType::NORMAL);
		return make_uniq<ArrowType>(map_type, std::move(map_type_info));
	}
	throw NotImplementedException("Unsupported Internal Arrow Type %s", format);
}